

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

Reals __thiscall
Omega_h::diffuse_densities_once
          (Omega_h *this,Mesh *mesh,Graph *g,Reals *densities,Reals *cell_sizes)

{
  Int IVar1;
  LO n;
  uint uVar2;
  void *extraout_RDX;
  Reals RVar3;
  Write<double> local_100;
  Read<double> local_f0;
  undefined1 local_e0 [8];
  type f;
  int max_deg;
  allocator local_71;
  string local_70 [32];
  Read<double> local_50;
  undefined1 local_40 [8];
  Write<double> out;
  Reals *cell_sizes_local;
  Reals *densities_local;
  Graph *g_local;
  Mesh *mesh_local;
  
  out.shared_alloc_.direct_ptr = cell_sizes;
  Read<double>::Read(&local_50,densities);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  deep_copy<double>((Omega_h *)local_40,(Read<signed_char> *)&local_50,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Read<double>::~Read(&local_50);
  IVar1 = Mesh::dim(mesh);
  f.out.shared_alloc_.direct_ptr._0_4_ = IVar1 + 1;
  Read<double>::Read((Read<double> *)local_e0,cell_sizes);
  Graph::Graph((Graph *)&f.cell_sizes.write_.shared_alloc_.direct_ptr,g);
  f.g.ab2b.write_.shared_alloc_.direct_ptr._0_4_ = (int)f.out.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<double> *)&f.max_deg,densities);
  Write<double>::Write
            ((Write<double> *)&f.densities.write_.shared_alloc_.direct_ptr,(Write<double> *)local_40
            );
  n = Mesh::nelems(mesh);
  parallel_for<Omega_h::diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)::__0>
            (n,(type *)local_e0,"diffuse_densities");
  uVar2 = Mesh::dim(mesh);
  Write<double>::Write(&local_100,(Write<double> *)local_40);
  Read<double>::Read(&local_f0,&local_100);
  Mesh::sync_array<double>((Mesh *)this,(Int)mesh,(Read<double> *)(ulong)uVar2,(Int)&local_f0);
  Read<double>::~Read(&local_f0);
  Write<double>::~Write(&local_100);
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)local_e0);
  Write<double>::~Write((Write<double> *)local_40);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals diffuse_densities_once(
    Mesh* mesh, Graph g, Reals densities, Reals cell_sizes) {
  auto out = deep_copy(densities);
  auto max_deg = mesh->dim() + 1;
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto s = cell_sizes[e];
    for (auto ee = g.a2ab[e]; ee < g.a2ab[e + 1]; ++ee) {
      auto oe = g.ab2b[ee];
      auto os = cell_sizes[oe];
      auto mins = min2(s, os);  // minimum of this and other cell size
      /* get difference in densities, multiply by (mins / max_deg)
         to get a mass value that is below the stable limit,
         then divide that mass value by (s) to get the density
         delta to add to this density */
      auto factor = mins / (s * max_deg);
      auto x = densities[e];
      auto ox = densities[oe];
      out[e] += (ox - x) * factor;
    }
  };
  parallel_for(mesh->nelems(), f, "diffuse_densities");
  return mesh->sync_array(mesh->dim(), Reals(out), 1);
}